

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall pbrt::ParsedScene::AttributeBegin(ParsedScene *this,FileLoc loc)

{
  pair<char,_pbrt::FileLoc> local_30;
  
  if (this->currentBlock != OptionsBlock) {
    std::vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
    ::push_back(&this->pushedGraphicsStates,&this->graphicsState);
    local_30.first = 'a';
    local_30.second.line = loc.line;
    local_30.second.column = loc.column;
    local_30.second.filename._M_len = loc.filename._M_len;
    local_30.second.filename._M_str = loc.filename._M_str;
    std::vector<std::pair<char,pbrt::FileLoc>,std::allocator<std::pair<char,pbrt::FileLoc>>>::
    emplace_back<std::pair<char,pbrt::FileLoc>>
              ((vector<std::pair<char,pbrt::FileLoc>,std::allocator<std::pair<char,pbrt::FileLoc>>>
                *)&this->pushStack,&local_30);
    return;
  }
  ErrorExit<char_const(&)[15]>
            (&loc,"Scene description must be inside world block; \"%s\" is not allowed.",
             (char (*) [15])0x2c75969);
}

Assistant:

void ParsedScene::AttributeBegin(FileLoc loc) {
    VERIFY_WORLD("AttributeBegin");
    pushedGraphicsStates.push_back(graphicsState);
    pushStack.push_back(std::make_pair('a', loc));
}